

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_simple
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte bVar2;
  
  do {
    do {
      pbVar1 = (byte *)s;
      bVar2 = *pbVar1;
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) goto LAB_00104778;
      bVar2 = pbVar1[1];
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
        pbVar1 = pbVar1 + 1;
        goto LAB_00104778;
      }
      bVar2 = pbVar1[2];
      if (((anonymous_namespace)::chartype_table[bVar2] & 2) != 0) {
        pbVar1 = pbVar1 + 2;
        goto LAB_00104778;
      }
      bVar2 = pbVar1[3];
      s = (char_t *)(pbVar1 + 4);
    } while (((anonymous_namespace)::chartype_table[bVar2] & 2) == 0);
    pbVar1 = pbVar1 + 3;
LAB_00104778:
    if (bVar2 == end_quote) {
      *pbVar1 = 0;
      return (char_t *)(pbVar1 + 1);
    }
    if (bVar2 == 0) {
      return (char_t *)0x0;
    }
    s = (char_t *)(pbVar1 + 1);
  } while( true );
}

Assistant:

static char_t* parse_simple(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPE(ss, ct_parse_attr));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}